

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding.cpp
# Opt level: O3

void ncnn::copy_make_border_image<signed_char>(Mat *src,Mat *dst,int top,int left,int type,char v)

{
  undefined1 uVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  void *__s;
  int iVar9;
  uint __c;
  undefined1 *__src;
  ulong __n;
  ulong uVar10;
  undefined1 *__src_00;
  ulong uVar11;
  uint uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  int iVar39;
  undefined1 auVar34 [16];
  int iVar40;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  int iVar101;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  int iVar102;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  int iVar103;
  int iVar115;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar116 [16];
  undefined1 in_XMM13 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  int local_7c;
  
  __n = (ulong)(uint)left;
  uVar2 = dst->w;
  lVar4 = (long)(int)uVar2;
  iVar3 = dst->h;
  __src_00 = (undefined1 *)src->data;
  __s = dst->data;
  if (type == 0) {
    __c = (uint)(byte)v;
    iVar101 = top;
    if (top < 1) {
      iVar9 = 0;
    }
    else {
      do {
        if (0 < (int)uVar2) {
          memset(__s,__c,(ulong)uVar2);
        }
        __s = (void *)((long)__s + lVar4);
        iVar101 = iVar101 + -1;
        iVar9 = top;
      } while (iVar101 != 0);
    }
    if (iVar9 < src->h + top) {
      uVar11 = 0;
      if (0 < left) {
        uVar11 = __n;
      }
      do {
        uVar10 = 0;
        if (0 < left) {
          memset(__s,__c,__n);
          uVar10 = __n;
        }
        iVar101 = src->w;
        if ((long)iVar101 < 0xc) {
          uVar8 = uVar11;
          if ((int)uVar10 < iVar101 + left) {
            do {
              *(undefined1 *)((long)__s + uVar8) = __src_00[uVar8 - (long)left];
              uVar10 = uVar8 + 1;
              iVar101 = src->w;
              uVar8 = uVar10;
            } while ((long)uVar10 < (long)(iVar101 + left));
          }
        }
        else {
          memcpy((void *)((long)__s + (long)left),__src_00,(long)iVar101);
          iVar101 = src->w;
          uVar10 = (ulong)(uint)((int)uVar10 + iVar101);
        }
        uVar12 = (uint)uVar10;
        if ((int)uVar12 < (int)uVar2) {
          memset((void *)((long)(int)uVar12 + (long)__s),__c,(ulong)(~uVar12 + uVar2) + 1);
          iVar101 = src->w;
        }
        __src_00 = __src_00 + iVar101;
        __s = (void *)((long)__s + lVar4);
        iVar9 = iVar9 + 1;
      } while (iVar9 < src->h + top);
    }
    local_7c = iVar3 - iVar9;
    if (local_7c != 0 && iVar9 <= iVar3) {
      do {
        if (0 < (int)uVar2) {
          memset(__s,__c,(ulong)uVar2);
        }
        __s = (void *)((long)__s + lVar4);
        local_7c = local_7c + -1;
      } while (local_7c != 0);
    }
  }
  else if (type == 1) {
    lVar7 = (long)left;
    uVar11 = (ulong)(uint)left;
    if (top < 1) {
      iVar101 = 0;
    }
    else {
      lVar5 = uVar11 - 1;
      auVar36._8_4_ = (int)lVar5;
      auVar36._0_8_ = lVar5;
      auVar36._12_4_ = (int)((ulong)lVar5 >> 0x20);
      iVar9 = 0;
      auVar130 = _DAT_0015d1a0;
      do {
        uVar10 = 0;
        if (0 < left) {
          uVar1 = *__src_00;
          uVar8 = 0;
          auVar52 = _DAT_0015d310;
          auVar121 = _DAT_0015d300;
          auVar86 = _DAT_0015d8a0;
          auVar19 = _DAT_0015d890;
          auVar22 = _DAT_0015d880;
          auVar25 = _DAT_0015d870;
          auVar28 = _DAT_0015d860;
          auVar31 = _DAT_0015d850;
          do {
            auVar34 = auVar36 ^ auVar130;
            auVar41 = auVar52 ^ auVar130;
            iVar101 = auVar34._0_4_;
            iVar103 = -(uint)(iVar101 < auVar41._0_4_);
            iVar102 = auVar34._4_4_;
            auVar42._4_4_ = -(uint)(iVar102 < auVar41._4_4_);
            iVar39 = auVar34._8_4_;
            iVar115 = -(uint)(iVar39 < auVar41._8_4_);
            iVar40 = auVar34._12_4_;
            auVar42._12_4_ = -(uint)(iVar40 < auVar41._12_4_);
            auVar77._4_4_ = iVar103;
            auVar77._0_4_ = iVar103;
            auVar77._8_4_ = iVar115;
            auVar77._12_4_ = iVar115;
            auVar116 = pshuflw(in_XMM12,auVar77,0xe8);
            auVar34._4_4_ = -(uint)(auVar41._4_4_ == iVar102);
            auVar34._12_4_ = -(uint)(auVar41._12_4_ == iVar40);
            auVar34._0_4_ = auVar34._4_4_;
            auVar34._8_4_ = auVar34._12_4_;
            auVar117 = pshuflw(in_XMM13,auVar34,0xe8);
            auVar42._0_4_ = auVar42._4_4_;
            auVar42._8_4_ = auVar42._12_4_;
            auVar41 = pshuflw(auVar116,auVar42,0xe8);
            auVar118._8_4_ = 0xffffffff;
            auVar118._0_8_ = 0xffffffffffffffff;
            auVar118._12_4_ = 0xffffffff;
            auVar41 = (auVar41 | auVar117 & auVar116) ^ auVar118;
            auVar41 = packssdw(auVar41,auVar41);
            if ((auVar41 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(undefined1 *)((long)__s + uVar8) = uVar1;
            }
            auVar42 = auVar34 & auVar77 | auVar42;
            auVar34 = packssdw(auVar42,auVar42);
            auVar34 = packssdw(auVar34 ^ auVar118,auVar34 ^ auVar118);
            auVar34 = packsswb(auVar34,auVar34);
            if ((auVar34._0_4_ >> 8 & 1) != 0) {
              *(undefined1 *)((long)__s + uVar8 + 1) = uVar1;
            }
            auVar34 = auVar121 ^ auVar130;
            iVar103 = -(uint)(iVar101 < auVar34._0_4_);
            auVar117._4_4_ = -(uint)(iVar102 < auVar34._4_4_);
            iVar115 = -(uint)(iVar39 < auVar34._8_4_);
            auVar117._12_4_ = -(uint)(iVar40 < auVar34._12_4_);
            auVar41._4_4_ = iVar103;
            auVar41._0_4_ = iVar103;
            auVar41._8_4_ = iVar115;
            auVar41._12_4_ = iVar115;
            auVar116._4_4_ = -(uint)(auVar34._4_4_ == iVar102);
            auVar116._12_4_ = -(uint)(auVar34._12_4_ == iVar40);
            auVar116._0_4_ = auVar116._4_4_;
            auVar116._8_4_ = auVar116._12_4_;
            auVar117._0_4_ = auVar117._4_4_;
            auVar117._8_4_ = auVar117._12_4_;
            auVar34 = auVar116 & auVar41 | auVar117;
            auVar34 = packssdw(auVar34,auVar34);
            auVar34 = packssdw(auVar34 ^ auVar118,auVar34 ^ auVar118);
            auVar34 = packsswb(auVar34,auVar34);
            if ((auVar34._0_4_ >> 0x10 & 1) != 0) {
              *(undefined1 *)((long)__s + uVar8 + 2) = uVar1;
            }
            auVar41 = pshufhw(auVar41,auVar41,0x84);
            auVar77 = pshufhw(auVar116,auVar116,0x84);
            auVar42 = pshufhw(auVar41,auVar117,0x84);
            auVar41 = (auVar42 | auVar77 & auVar41) ^ auVar118;
            auVar41 = packssdw(auVar41,auVar41);
            auVar41 = packsswb(auVar41,auVar41);
            if ((auVar41._0_4_ >> 0x18 & 1) != 0) {
              *(undefined1 *)((long)__s + uVar8 + 3) = uVar1;
            }
            auVar41 = auVar86 ^ auVar130;
            iVar103 = -(uint)(iVar101 < auVar41._0_4_);
            auVar44._4_4_ = -(uint)(iVar102 < auVar41._4_4_);
            iVar115 = -(uint)(iVar39 < auVar41._8_4_);
            auVar44._12_4_ = -(uint)(iVar40 < auVar41._12_4_);
            auVar78._4_4_ = iVar103;
            auVar78._0_4_ = iVar103;
            auVar78._8_4_ = iVar115;
            auVar78._12_4_ = iVar115;
            auVar34 = pshuflw(auVar34,auVar78,0xe8);
            auVar43._4_4_ = -(uint)(auVar41._4_4_ == iVar102);
            auVar43._12_4_ = -(uint)(auVar41._12_4_ == iVar40);
            auVar43._0_4_ = auVar43._4_4_;
            auVar43._8_4_ = auVar43._12_4_;
            auVar42 = pshuflw(auVar118,auVar43,0xe8);
            auVar44._0_4_ = auVar44._4_4_;
            auVar44._8_4_ = auVar44._12_4_;
            auVar41 = pshuflw(auVar34,auVar44,0xe8);
            auVar119._8_4_ = 0xffffffff;
            auVar119._0_8_ = 0xffffffffffffffff;
            auVar119._12_4_ = 0xffffffff;
            auVar34 = (auVar41 | auVar42 & auVar34) ^ auVar119;
            auVar34 = packssdw(auVar34,auVar34);
            auVar34 = packsswb(auVar34,auVar34);
            if ((auVar34 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(undefined1 *)((long)__s + uVar8 + 4) = uVar1;
            }
            auVar44 = auVar43 & auVar78 | auVar44;
            auVar34 = packssdw(auVar44,auVar44);
            auVar34 = packssdw(auVar34 ^ auVar119,auVar34 ^ auVar119);
            auVar34 = packsswb(auVar34,auVar34);
            if ((auVar34._4_2_ >> 8 & 1) != 0) {
              *(undefined1 *)((long)__s + uVar8 + 5) = uVar1;
            }
            auVar34 = auVar19 ^ auVar130;
            iVar103 = -(uint)(iVar101 < auVar34._0_4_);
            auVar104._4_4_ = -(uint)(iVar102 < auVar34._4_4_);
            iVar115 = -(uint)(iVar39 < auVar34._8_4_);
            auVar104._12_4_ = -(uint)(iVar40 < auVar34._12_4_);
            auVar45._4_4_ = iVar103;
            auVar45._0_4_ = iVar103;
            auVar45._8_4_ = iVar115;
            auVar45._12_4_ = iVar115;
            auVar79._4_4_ = -(uint)(auVar34._4_4_ == iVar102);
            auVar79._12_4_ = -(uint)(auVar34._12_4_ == iVar40);
            auVar79._0_4_ = auVar79._4_4_;
            auVar79._8_4_ = auVar79._12_4_;
            auVar104._0_4_ = auVar104._4_4_;
            auVar104._8_4_ = auVar104._12_4_;
            auVar34 = auVar79 & auVar45 | auVar104;
            auVar34 = packssdw(auVar34,auVar34);
            auVar34 = packssdw(auVar34 ^ auVar119,auVar34 ^ auVar119);
            auVar34 = packsswb(auVar34,auVar34);
            if ((auVar34 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(undefined1 *)((long)__s + uVar8 + 6) = uVar1;
            }
            auVar41 = pshufhw(auVar45,auVar45,0x84);
            auVar77 = pshufhw(auVar79,auVar79,0x84);
            auVar42 = pshufhw(auVar41,auVar104,0x84);
            auVar41 = (auVar42 | auVar77 & auVar41) ^ auVar119;
            auVar41 = packssdw(auVar41,auVar41);
            auVar41 = packsswb(auVar41,auVar41);
            if ((auVar41._6_2_ >> 8 & 1) != 0) {
              *(undefined1 *)((long)__s + uVar8 + 7) = uVar1;
            }
            auVar41 = auVar22 ^ auVar130;
            iVar103 = -(uint)(iVar101 < auVar41._0_4_);
            auVar47._4_4_ = -(uint)(iVar102 < auVar41._4_4_);
            iVar115 = -(uint)(iVar39 < auVar41._8_4_);
            auVar47._12_4_ = -(uint)(iVar40 < auVar41._12_4_);
            auVar80._4_4_ = iVar103;
            auVar80._0_4_ = iVar103;
            auVar80._8_4_ = iVar115;
            auVar80._12_4_ = iVar115;
            auVar34 = pshuflw(auVar34,auVar80,0xe8);
            auVar46._4_4_ = -(uint)(auVar41._4_4_ == iVar102);
            auVar46._12_4_ = -(uint)(auVar41._12_4_ == iVar40);
            auVar46._0_4_ = auVar46._4_4_;
            auVar46._8_4_ = auVar46._12_4_;
            auVar42 = pshuflw(auVar119,auVar46,0xe8);
            auVar47._0_4_ = auVar47._4_4_;
            auVar47._8_4_ = auVar47._12_4_;
            auVar41 = pshuflw(auVar34,auVar47,0xe8);
            auVar120._8_4_ = 0xffffffff;
            auVar120._0_8_ = 0xffffffffffffffff;
            auVar120._12_4_ = 0xffffffff;
            auVar34 = (auVar41 | auVar42 & auVar34) ^ auVar120;
            auVar34 = packssdw(auVar34,auVar34);
            auVar34 = packsswb(auVar34,auVar34);
            if ((auVar34 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(undefined1 *)((long)__s + uVar8 + 8) = uVar1;
            }
            auVar47 = auVar46 & auVar80 | auVar47;
            auVar34 = packssdw(auVar47,auVar47);
            auVar34 = packssdw(auVar34 ^ auVar120,auVar34 ^ auVar120);
            auVar34 = packsswb(auVar34,auVar34);
            if ((auVar34._8_2_ >> 8 & 1) != 0) {
              *(undefined1 *)((long)__s + uVar8 + 9) = uVar1;
            }
            auVar34 = auVar25 ^ auVar130;
            iVar103 = -(uint)(iVar101 < auVar34._0_4_);
            auVar105._4_4_ = -(uint)(iVar102 < auVar34._4_4_);
            iVar115 = -(uint)(iVar39 < auVar34._8_4_);
            auVar105._12_4_ = -(uint)(iVar40 < auVar34._12_4_);
            auVar48._4_4_ = iVar103;
            auVar48._0_4_ = iVar103;
            auVar48._8_4_ = iVar115;
            auVar48._12_4_ = iVar115;
            auVar81._4_4_ = -(uint)(auVar34._4_4_ == iVar102);
            auVar81._12_4_ = -(uint)(auVar34._12_4_ == iVar40);
            auVar81._0_4_ = auVar81._4_4_;
            auVar81._8_4_ = auVar81._12_4_;
            auVar105._0_4_ = auVar105._4_4_;
            auVar105._8_4_ = auVar105._12_4_;
            auVar34 = auVar81 & auVar48 | auVar105;
            auVar34 = packssdw(auVar34,auVar34);
            auVar34 = packssdw(auVar34 ^ auVar120,auVar34 ^ auVar120);
            auVar34 = packsswb(auVar34,auVar34);
            if ((auVar34 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              *(undefined1 *)((long)__s + uVar8 + 10) = uVar1;
            }
            auVar41 = pshufhw(auVar48,auVar48,0x84);
            auVar77 = pshufhw(auVar81,auVar81,0x84);
            auVar42 = pshufhw(auVar41,auVar105,0x84);
            auVar41 = (auVar42 | auVar77 & auVar41) ^ auVar120;
            auVar41 = packssdw(auVar41,auVar41);
            auVar41 = packsswb(auVar41,auVar41);
            if ((auVar41._10_2_ >> 8 & 1) != 0) {
              *(undefined1 *)((long)__s + uVar8 + 0xb) = uVar1;
            }
            auVar41 = auVar28 ^ auVar130;
            iVar103 = -(uint)(iVar101 < auVar41._0_4_);
            auVar50._4_4_ = -(uint)(iVar102 < auVar41._4_4_);
            iVar115 = -(uint)(iVar39 < auVar41._8_4_);
            auVar50._12_4_ = -(uint)(iVar40 < auVar41._12_4_);
            auVar82._4_4_ = iVar103;
            auVar82._0_4_ = iVar103;
            auVar82._8_4_ = iVar115;
            auVar82._12_4_ = iVar115;
            auVar34 = pshuflw(auVar34,auVar82,0xe8);
            auVar49._4_4_ = -(uint)(auVar41._4_4_ == iVar102);
            auVar49._12_4_ = -(uint)(auVar41._12_4_ == iVar40);
            auVar49._0_4_ = auVar49._4_4_;
            auVar49._8_4_ = auVar49._12_4_;
            auVar42 = pshuflw(auVar120,auVar49,0xe8);
            auVar50._0_4_ = auVar50._4_4_;
            auVar50._8_4_ = auVar50._12_4_;
            auVar41 = pshuflw(auVar34,auVar50,0xe8);
            in_XMM13._8_4_ = 0xffffffff;
            in_XMM13._0_8_ = 0xffffffffffffffff;
            in_XMM13._12_4_ = 0xffffffff;
            auVar34 = (auVar41 | auVar42 & auVar34) ^ in_XMM13;
            auVar34 = packssdw(auVar34,auVar34);
            auVar34 = packsswb(auVar34,auVar34);
            if ((auVar34 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(undefined1 *)((long)__s + uVar8 + 0xc) = uVar1;
            }
            auVar50 = auVar49 & auVar82 | auVar50;
            auVar34 = packssdw(auVar50,auVar50);
            auVar34 = packssdw(auVar34 ^ in_XMM13,auVar34 ^ in_XMM13);
            auVar34 = packsswb(auVar34,auVar34);
            if ((auVar34._12_2_ >> 8 & 1) != 0) {
              *(undefined1 *)((long)__s + uVar8 + 0xd) = uVar1;
            }
            auVar34 = auVar31 ^ auVar130;
            auVar106._0_4_ = -(uint)(iVar101 < auVar34._0_4_);
            auVar106._4_4_ = -(uint)(iVar102 < auVar34._4_4_);
            auVar106._8_4_ = -(uint)(iVar39 < auVar34._8_4_);
            auVar106._12_4_ = -(uint)(iVar40 < auVar34._12_4_);
            auVar51._4_4_ = auVar106._0_4_;
            auVar51._0_4_ = auVar106._0_4_;
            auVar51._8_4_ = auVar106._8_4_;
            auVar51._12_4_ = auVar106._8_4_;
            iVar101 = -(uint)(auVar34._4_4_ == iVar102);
            iVar102 = -(uint)(auVar34._12_4_ == iVar40);
            auVar35._4_4_ = iVar101;
            auVar35._0_4_ = iVar101;
            auVar35._8_4_ = iVar102;
            auVar35._12_4_ = iVar102;
            auVar83._4_4_ = auVar106._4_4_;
            auVar83._0_4_ = auVar106._4_4_;
            auVar83._8_4_ = auVar106._12_4_;
            auVar83._12_4_ = auVar106._12_4_;
            in_XMM12 = auVar35 & auVar51 | auVar83;
            auVar34 = packssdw(auVar106,in_XMM12);
            auVar34 = packssdw(auVar34 ^ in_XMM13,auVar34 ^ in_XMM13);
            auVar34 = packsswb(auVar34,auVar34);
            if ((auVar34 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(undefined1 *)((long)__s + uVar8 + 0xe) = uVar1;
            }
            auVar41 = pshufhw(auVar51,auVar51,0x84);
            auVar34 = pshufhw(auVar35,auVar35,0x84);
            auVar42 = pshufhw(auVar41,auVar83,0x84);
            auVar34 = packssdw(auVar34 & auVar41,(auVar42 | auVar34 & auVar41) ^ in_XMM13);
            auVar34 = packsswb(auVar34,auVar34);
            if ((auVar34._14_2_ >> 8 & 1) != 0) {
              *(undefined1 *)((long)__s + uVar8 + 0xf) = uVar1;
            }
            uVar8 = uVar8 + 0x10;
            lVar5 = auVar52._8_8_;
            auVar52._0_8_ = auVar52._0_8_ + 0x10;
            auVar52._8_8_ = lVar5 + 0x10;
            lVar5 = auVar121._8_8_;
            auVar121._0_8_ = auVar121._0_8_ + 0x10;
            auVar121._8_8_ = lVar5 + 0x10;
            lVar5 = auVar86._8_8_;
            auVar86._0_8_ = auVar86._0_8_ + 0x10;
            auVar86._8_8_ = lVar5 + 0x10;
            lVar5 = auVar19._8_8_;
            auVar19._0_8_ = auVar19._0_8_ + 0x10;
            auVar19._8_8_ = lVar5 + 0x10;
            lVar5 = auVar22._8_8_;
            auVar22._0_8_ = auVar22._0_8_ + 0x10;
            auVar22._8_8_ = lVar5 + 0x10;
            lVar5 = auVar25._8_8_;
            auVar25._0_8_ = auVar25._0_8_ + 0x10;
            auVar25._8_8_ = lVar5 + 0x10;
            lVar5 = auVar28._8_8_;
            auVar28._0_8_ = auVar28._0_8_ + 0x10;
            auVar28._8_8_ = lVar5 + 0x10;
            lVar5 = auVar31._8_8_;
            auVar31._0_8_ = auVar31._0_8_ + 0x10;
            auVar31._8_8_ = lVar5 + 0x10;
            uVar10 = __n;
          } while ((left + 0xfU & 0xfffffff0) != uVar8);
        }
        iVar101 = src->w;
        if ((long)iVar101 < 0xc) {
          if ((int)uVar10 < iVar101 + left) {
            do {
              *(undefined1 *)((long)__s + uVar10) = __src_00[uVar10 - lVar7];
              uVar10 = uVar10 + 1;
            } while ((long)uVar10 < src->w + lVar7);
          }
        }
        else {
          memcpy((void *)((long)__s + lVar7),__src_00,(long)iVar101);
          uVar10 = (ulong)(uint)((int)uVar10 + src->w);
          auVar130 = _DAT_0015d1a0;
        }
        if ((int)uVar10 < (int)uVar2) {
          lVar5 = (long)(int)uVar10;
          do {
            *(undefined1 *)((long)__s + lVar5) = __src_00[(long)src->w + -1];
            lVar5 = lVar5 + 1;
          } while (lVar4 != lVar5);
        }
        __s = (void *)((long)__s + lVar4);
        iVar9 = iVar9 + 1;
        iVar101 = top;
      } while (iVar9 != top);
    }
    if (iVar101 < src->h + top) {
      lVar5 = uVar11 - 1;
      auVar128._8_4_ = (int)lVar5;
      auVar128._0_8_ = lVar5;
      auVar128._12_4_ = (int)((ulong)lVar5 >> 0x20);
      auVar130 = _DAT_0015d1a0;
      do {
        uVar10 = 0;
        if (0 < left) {
          uVar1 = *__src_00;
          uVar8 = 0;
          auVar13 = _DAT_0015d310;
          auVar15 = _DAT_0015d300;
          auVar17 = _DAT_0015d8a0;
          auVar20 = _DAT_0015d890;
          auVar23 = _DAT_0015d880;
          auVar26 = _DAT_0015d870;
          auVar29 = _DAT_0015d860;
          auVar32 = _DAT_0015d850;
          do {
            auVar36 = auVar128 ^ auVar130;
            auVar52 = auVar13 ^ auVar130;
            iVar9 = auVar36._0_4_;
            iVar103 = -(uint)(iVar9 < auVar52._0_4_);
            iVar102 = auVar36._4_4_;
            auVar54._4_4_ = -(uint)(iVar102 < auVar52._4_4_);
            iVar39 = auVar36._8_4_;
            iVar115 = -(uint)(iVar39 < auVar52._8_4_);
            iVar40 = auVar36._12_4_;
            auVar54._12_4_ = -(uint)(iVar40 < auVar52._12_4_);
            auVar84._4_4_ = iVar103;
            auVar84._0_4_ = iVar103;
            auVar84._8_4_ = iVar115;
            auVar84._12_4_ = iVar115;
            auVar36 = pshuflw(in_XMM12,auVar84,0xe8);
            auVar53._4_4_ = -(uint)(auVar52._4_4_ == iVar102);
            auVar53._12_4_ = -(uint)(auVar52._12_4_ == iVar40);
            auVar53._0_4_ = auVar53._4_4_;
            auVar53._8_4_ = auVar53._12_4_;
            auVar121 = pshuflw(in_XMM13,auVar53,0xe8);
            auVar54._0_4_ = auVar54._4_4_;
            auVar54._8_4_ = auVar54._12_4_;
            auVar52 = pshuflw(auVar36,auVar54,0xe8);
            auVar122._8_4_ = 0xffffffff;
            auVar122._0_8_ = 0xffffffffffffffff;
            auVar122._12_4_ = 0xffffffff;
            auVar36 = (auVar52 | auVar121 & auVar36) ^ auVar122;
            auVar36 = packssdw(auVar36,auVar36);
            if ((auVar36 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(undefined1 *)((long)__s + uVar8) = uVar1;
            }
            auVar54 = auVar53 & auVar84 | auVar54;
            auVar36 = packssdw(auVar54,auVar54);
            auVar36 = packssdw(auVar36 ^ auVar122,auVar36 ^ auVar122);
            auVar36 = packsswb(auVar36,auVar36);
            if ((auVar36._0_4_ >> 8 & 1) != 0) {
              *(undefined1 *)((long)__s + uVar8 + 1) = uVar1;
            }
            auVar36 = auVar15 ^ auVar130;
            iVar103 = -(uint)(iVar9 < auVar36._0_4_);
            auVar107._4_4_ = -(uint)(iVar102 < auVar36._4_4_);
            iVar115 = -(uint)(iVar39 < auVar36._8_4_);
            auVar107._12_4_ = -(uint)(iVar40 < auVar36._12_4_);
            auVar55._4_4_ = iVar103;
            auVar55._0_4_ = iVar103;
            auVar55._8_4_ = iVar115;
            auVar55._12_4_ = iVar115;
            auVar85._4_4_ = -(uint)(auVar36._4_4_ == iVar102);
            auVar85._12_4_ = -(uint)(auVar36._12_4_ == iVar40);
            auVar85._0_4_ = auVar85._4_4_;
            auVar85._8_4_ = auVar85._12_4_;
            auVar107._0_4_ = auVar107._4_4_;
            auVar107._8_4_ = auVar107._12_4_;
            auVar36 = auVar85 & auVar55 | auVar107;
            auVar36 = packssdw(auVar36,auVar36);
            auVar36 = packssdw(auVar36 ^ auVar122,auVar36 ^ auVar122);
            auVar36 = packsswb(auVar36,auVar36);
            if ((auVar36._0_4_ >> 0x10 & 1) != 0) {
              *(undefined1 *)((long)__s + uVar8 + 2) = uVar1;
            }
            auVar52 = pshufhw(auVar55,auVar55,0x84);
            auVar86 = pshufhw(auVar85,auVar85,0x84);
            auVar121 = pshufhw(auVar52,auVar107,0x84);
            auVar52 = (auVar121 | auVar86 & auVar52) ^ auVar122;
            auVar52 = packssdw(auVar52,auVar52);
            auVar52 = packsswb(auVar52,auVar52);
            if ((auVar52._0_4_ >> 0x18 & 1) != 0) {
              *(undefined1 *)((long)__s + uVar8 + 3) = uVar1;
            }
            auVar52 = auVar17 ^ auVar130;
            iVar103 = -(uint)(iVar9 < auVar52._0_4_);
            auVar57._4_4_ = -(uint)(iVar102 < auVar52._4_4_);
            iVar115 = -(uint)(iVar39 < auVar52._8_4_);
            auVar57._12_4_ = -(uint)(iVar40 < auVar52._12_4_);
            auVar87._4_4_ = iVar103;
            auVar87._0_4_ = iVar103;
            auVar87._8_4_ = iVar115;
            auVar87._12_4_ = iVar115;
            auVar36 = pshuflw(auVar36,auVar87,0xe8);
            auVar56._4_4_ = -(uint)(auVar52._4_4_ == iVar102);
            auVar56._12_4_ = -(uint)(auVar52._12_4_ == iVar40);
            auVar56._0_4_ = auVar56._4_4_;
            auVar56._8_4_ = auVar56._12_4_;
            auVar121 = pshuflw(auVar122,auVar56,0xe8);
            auVar57._0_4_ = auVar57._4_4_;
            auVar57._8_4_ = auVar57._12_4_;
            auVar52 = pshuflw(auVar36,auVar57,0xe8);
            auVar123._8_4_ = 0xffffffff;
            auVar123._0_8_ = 0xffffffffffffffff;
            auVar123._12_4_ = 0xffffffff;
            auVar36 = (auVar52 | auVar121 & auVar36) ^ auVar123;
            auVar36 = packssdw(auVar36,auVar36);
            auVar36 = packsswb(auVar36,auVar36);
            if ((auVar36 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(undefined1 *)((long)__s + uVar8 + 4) = uVar1;
            }
            auVar57 = auVar56 & auVar87 | auVar57;
            auVar36 = packssdw(auVar57,auVar57);
            auVar36 = packssdw(auVar36 ^ auVar123,auVar36 ^ auVar123);
            auVar36 = packsswb(auVar36,auVar36);
            if ((auVar36._4_2_ >> 8 & 1) != 0) {
              *(undefined1 *)((long)__s + uVar8 + 5) = uVar1;
            }
            auVar36 = auVar20 ^ auVar130;
            iVar103 = -(uint)(iVar9 < auVar36._0_4_);
            auVar108._4_4_ = -(uint)(iVar102 < auVar36._4_4_);
            iVar115 = -(uint)(iVar39 < auVar36._8_4_);
            auVar108._12_4_ = -(uint)(iVar40 < auVar36._12_4_);
            auVar58._4_4_ = iVar103;
            auVar58._0_4_ = iVar103;
            auVar58._8_4_ = iVar115;
            auVar58._12_4_ = iVar115;
            auVar88._4_4_ = -(uint)(auVar36._4_4_ == iVar102);
            auVar88._12_4_ = -(uint)(auVar36._12_4_ == iVar40);
            auVar88._0_4_ = auVar88._4_4_;
            auVar88._8_4_ = auVar88._12_4_;
            auVar108._0_4_ = auVar108._4_4_;
            auVar108._8_4_ = auVar108._12_4_;
            auVar36 = auVar88 & auVar58 | auVar108;
            auVar36 = packssdw(auVar36,auVar36);
            auVar36 = packssdw(auVar36 ^ auVar123,auVar36 ^ auVar123);
            auVar36 = packsswb(auVar36,auVar36);
            if ((auVar36 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(undefined1 *)((long)__s + uVar8 + 6) = uVar1;
            }
            auVar52 = pshufhw(auVar58,auVar58,0x84);
            auVar86 = pshufhw(auVar88,auVar88,0x84);
            auVar121 = pshufhw(auVar52,auVar108,0x84);
            auVar52 = (auVar121 | auVar86 & auVar52) ^ auVar123;
            auVar52 = packssdw(auVar52,auVar52);
            auVar52 = packsswb(auVar52,auVar52);
            if ((auVar52._6_2_ >> 8 & 1) != 0) {
              *(undefined1 *)((long)__s + uVar8 + 7) = uVar1;
            }
            auVar52 = auVar23 ^ auVar130;
            iVar103 = -(uint)(iVar9 < auVar52._0_4_);
            auVar60._4_4_ = -(uint)(iVar102 < auVar52._4_4_);
            iVar115 = -(uint)(iVar39 < auVar52._8_4_);
            auVar60._12_4_ = -(uint)(iVar40 < auVar52._12_4_);
            auVar89._4_4_ = iVar103;
            auVar89._0_4_ = iVar103;
            auVar89._8_4_ = iVar115;
            auVar89._12_4_ = iVar115;
            auVar36 = pshuflw(auVar36,auVar89,0xe8);
            auVar59._4_4_ = -(uint)(auVar52._4_4_ == iVar102);
            auVar59._12_4_ = -(uint)(auVar52._12_4_ == iVar40);
            auVar59._0_4_ = auVar59._4_4_;
            auVar59._8_4_ = auVar59._12_4_;
            auVar121 = pshuflw(auVar123,auVar59,0xe8);
            auVar60._0_4_ = auVar60._4_4_;
            auVar60._8_4_ = auVar60._12_4_;
            auVar52 = pshuflw(auVar36,auVar60,0xe8);
            auVar124._8_4_ = 0xffffffff;
            auVar124._0_8_ = 0xffffffffffffffff;
            auVar124._12_4_ = 0xffffffff;
            auVar36 = (auVar52 | auVar121 & auVar36) ^ auVar124;
            auVar36 = packssdw(auVar36,auVar36);
            auVar36 = packsswb(auVar36,auVar36);
            if ((auVar36 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(undefined1 *)((long)__s + uVar8 + 8) = uVar1;
            }
            auVar60 = auVar59 & auVar89 | auVar60;
            auVar36 = packssdw(auVar60,auVar60);
            auVar36 = packssdw(auVar36 ^ auVar124,auVar36 ^ auVar124);
            auVar36 = packsswb(auVar36,auVar36);
            if ((auVar36._8_2_ >> 8 & 1) != 0) {
              *(undefined1 *)((long)__s + uVar8 + 9) = uVar1;
            }
            auVar36 = auVar26 ^ auVar130;
            iVar103 = -(uint)(iVar9 < auVar36._0_4_);
            auVar109._4_4_ = -(uint)(iVar102 < auVar36._4_4_);
            iVar115 = -(uint)(iVar39 < auVar36._8_4_);
            auVar109._12_4_ = -(uint)(iVar40 < auVar36._12_4_);
            auVar61._4_4_ = iVar103;
            auVar61._0_4_ = iVar103;
            auVar61._8_4_ = iVar115;
            auVar61._12_4_ = iVar115;
            auVar90._4_4_ = -(uint)(auVar36._4_4_ == iVar102);
            auVar90._12_4_ = -(uint)(auVar36._12_4_ == iVar40);
            auVar90._0_4_ = auVar90._4_4_;
            auVar90._8_4_ = auVar90._12_4_;
            auVar109._0_4_ = auVar109._4_4_;
            auVar109._8_4_ = auVar109._12_4_;
            auVar36 = auVar90 & auVar61 | auVar109;
            auVar36 = packssdw(auVar36,auVar36);
            auVar36 = packssdw(auVar36 ^ auVar124,auVar36 ^ auVar124);
            auVar36 = packsswb(auVar36,auVar36);
            if ((auVar36 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              *(undefined1 *)((long)__s + uVar8 + 10) = uVar1;
            }
            auVar52 = pshufhw(auVar61,auVar61,0x84);
            auVar86 = pshufhw(auVar90,auVar90,0x84);
            auVar121 = pshufhw(auVar52,auVar109,0x84);
            auVar52 = (auVar121 | auVar86 & auVar52) ^ auVar124;
            auVar52 = packssdw(auVar52,auVar52);
            auVar52 = packsswb(auVar52,auVar52);
            if ((auVar52._10_2_ >> 8 & 1) != 0) {
              *(undefined1 *)((long)__s + uVar8 + 0xb) = uVar1;
            }
            auVar52 = auVar29 ^ auVar130;
            iVar103 = -(uint)(iVar9 < auVar52._0_4_);
            auVar63._4_4_ = -(uint)(iVar102 < auVar52._4_4_);
            iVar115 = -(uint)(iVar39 < auVar52._8_4_);
            auVar63._12_4_ = -(uint)(iVar40 < auVar52._12_4_);
            auVar91._4_4_ = iVar103;
            auVar91._0_4_ = iVar103;
            auVar91._8_4_ = iVar115;
            auVar91._12_4_ = iVar115;
            auVar36 = pshuflw(auVar36,auVar91,0xe8);
            auVar62._4_4_ = -(uint)(auVar52._4_4_ == iVar102);
            auVar62._12_4_ = -(uint)(auVar52._12_4_ == iVar40);
            auVar62._0_4_ = auVar62._4_4_;
            auVar62._8_4_ = auVar62._12_4_;
            auVar121 = pshuflw(auVar124,auVar62,0xe8);
            auVar63._0_4_ = auVar63._4_4_;
            auVar63._8_4_ = auVar63._12_4_;
            auVar52 = pshuflw(auVar36,auVar63,0xe8);
            in_XMM13._8_4_ = 0xffffffff;
            in_XMM13._0_8_ = 0xffffffffffffffff;
            in_XMM13._12_4_ = 0xffffffff;
            auVar36 = (auVar52 | auVar121 & auVar36) ^ in_XMM13;
            auVar36 = packssdw(auVar36,auVar36);
            auVar36 = packsswb(auVar36,auVar36);
            if ((auVar36 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(undefined1 *)((long)__s + uVar8 + 0xc) = uVar1;
            }
            auVar63 = auVar62 & auVar91 | auVar63;
            auVar36 = packssdw(auVar63,auVar63);
            auVar36 = packssdw(auVar36 ^ in_XMM13,auVar36 ^ in_XMM13);
            auVar36 = packsswb(auVar36,auVar36);
            if ((auVar36._12_2_ >> 8 & 1) != 0) {
              *(undefined1 *)((long)__s + uVar8 + 0xd) = uVar1;
            }
            auVar36 = auVar32 ^ auVar130;
            auVar110._0_4_ = -(uint)(iVar9 < auVar36._0_4_);
            auVar110._4_4_ = -(uint)(iVar102 < auVar36._4_4_);
            auVar110._8_4_ = -(uint)(iVar39 < auVar36._8_4_);
            auVar110._12_4_ = -(uint)(iVar40 < auVar36._12_4_);
            auVar64._4_4_ = auVar110._0_4_;
            auVar64._0_4_ = auVar110._0_4_;
            auVar64._8_4_ = auVar110._8_4_;
            auVar64._12_4_ = auVar110._8_4_;
            iVar9 = -(uint)(auVar36._4_4_ == iVar102);
            iVar102 = -(uint)(auVar36._12_4_ == iVar40);
            auVar37._4_4_ = iVar9;
            auVar37._0_4_ = iVar9;
            auVar37._8_4_ = iVar102;
            auVar37._12_4_ = iVar102;
            auVar92._4_4_ = auVar110._4_4_;
            auVar92._0_4_ = auVar110._4_4_;
            auVar92._8_4_ = auVar110._12_4_;
            auVar92._12_4_ = auVar110._12_4_;
            in_XMM12 = auVar37 & auVar64 | auVar92;
            auVar36 = packssdw(auVar110,in_XMM12);
            auVar36 = packssdw(auVar36 ^ in_XMM13,auVar36 ^ in_XMM13);
            auVar36 = packsswb(auVar36,auVar36);
            if ((auVar36 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(undefined1 *)((long)__s + uVar8 + 0xe) = uVar1;
            }
            auVar52 = pshufhw(auVar64,auVar64,0x84);
            auVar36 = pshufhw(auVar37,auVar37,0x84);
            auVar121 = pshufhw(auVar52,auVar92,0x84);
            auVar36 = packssdw(auVar36 & auVar52,(auVar121 | auVar36 & auVar52) ^ in_XMM13);
            auVar36 = packsswb(auVar36,auVar36);
            if ((auVar36._14_2_ >> 8 & 1) != 0) {
              *(undefined1 *)((long)__s + uVar8 + 0xf) = uVar1;
            }
            uVar8 = uVar8 + 0x10;
            lVar5 = auVar13._8_8_;
            auVar13._0_8_ = auVar13._0_8_ + 0x10;
            auVar13._8_8_ = lVar5 + 0x10;
            lVar5 = auVar15._8_8_;
            auVar15._0_8_ = auVar15._0_8_ + 0x10;
            auVar15._8_8_ = lVar5 + 0x10;
            lVar5 = auVar17._8_8_;
            auVar17._0_8_ = auVar17._0_8_ + 0x10;
            auVar17._8_8_ = lVar5 + 0x10;
            lVar5 = auVar20._8_8_;
            auVar20._0_8_ = auVar20._0_8_ + 0x10;
            auVar20._8_8_ = lVar5 + 0x10;
            lVar5 = auVar23._8_8_;
            auVar23._0_8_ = auVar23._0_8_ + 0x10;
            auVar23._8_8_ = lVar5 + 0x10;
            lVar5 = auVar26._8_8_;
            auVar26._0_8_ = auVar26._0_8_ + 0x10;
            auVar26._8_8_ = lVar5 + 0x10;
            lVar5 = auVar29._8_8_;
            auVar29._0_8_ = auVar29._0_8_ + 0x10;
            auVar29._8_8_ = lVar5 + 0x10;
            lVar5 = auVar32._8_8_;
            auVar32._0_8_ = auVar32._0_8_ + 0x10;
            auVar32._8_8_ = lVar5 + 0x10;
            uVar10 = __n;
          } while ((left + 0xfU & 0xfffffff0) != uVar8);
        }
        iVar9 = src->w;
        if ((long)iVar9 < 0xc) {
          if ((int)uVar10 < iVar9 + left) {
            do {
              *(undefined1 *)((long)__s + uVar10) = __src_00[uVar10 - lVar7];
              uVar10 = uVar10 + 1;
              iVar9 = src->w;
            } while ((long)uVar10 < (long)(iVar9 + left));
          }
        }
        else {
          memcpy((void *)((long)__s + lVar7),__src_00,(long)iVar9);
          iVar9 = src->w;
          uVar10 = (ulong)(uint)((int)uVar10 + iVar9);
          auVar130 = _DAT_0015d1a0;
        }
        if ((int)uVar10 < (int)uVar2) {
          lVar5 = (long)(int)uVar10;
          do {
            *(undefined1 *)((long)__s + lVar5) = __src_00[(long)src->w + -1];
            lVar5 = lVar5 + 1;
          } while (lVar4 != lVar5);
          iVar9 = src->w;
        }
        lVar5 = (long)iVar9;
        __src_00 = __src_00 + lVar5;
        __s = (void *)((long)__s + lVar4);
        iVar101 = iVar101 + 1;
      } while (iVar101 < src->h + top);
    }
    else {
      lVar5 = (long)src->w;
    }
    if (iVar101 < iVar3) {
      __src = __src_00 + -lVar5;
      lVar6 = uVar11 - 1;
      auVar129._8_4_ = (int)lVar6;
      auVar129._0_8_ = lVar6;
      auVar129._12_4_ = (int)((ulong)lVar6 >> 0x20);
      auVar130 = _DAT_0015d1a0;
      do {
        uVar11 = 0;
        if (0 < left) {
          uVar1 = *__src;
          uVar10 = 0;
          auVar14 = _DAT_0015d310;
          auVar16 = _DAT_0015d300;
          auVar18 = _DAT_0015d8a0;
          auVar21 = _DAT_0015d890;
          auVar24 = _DAT_0015d880;
          auVar27 = _DAT_0015d870;
          auVar30 = _DAT_0015d860;
          auVar33 = _DAT_0015d850;
          do {
            auVar36 = auVar129 ^ auVar130;
            auVar52 = auVar14 ^ auVar130;
            iVar9 = auVar36._0_4_;
            iVar103 = -(uint)(iVar9 < auVar52._0_4_);
            iVar102 = auVar36._4_4_;
            auVar66._4_4_ = -(uint)(iVar102 < auVar52._4_4_);
            iVar39 = auVar36._8_4_;
            iVar115 = -(uint)(iVar39 < auVar52._8_4_);
            iVar40 = auVar36._12_4_;
            auVar66._12_4_ = -(uint)(iVar40 < auVar52._12_4_);
            auVar93._4_4_ = iVar103;
            auVar93._0_4_ = iVar103;
            auVar93._8_4_ = iVar115;
            auVar93._12_4_ = iVar115;
            auVar36 = pshuflw(in_XMM12,auVar93,0xe8);
            auVar65._4_4_ = -(uint)(auVar52._4_4_ == iVar102);
            auVar65._12_4_ = -(uint)(auVar52._12_4_ == iVar40);
            auVar65._0_4_ = auVar65._4_4_;
            auVar65._8_4_ = auVar65._12_4_;
            auVar121 = pshuflw(in_XMM13,auVar65,0xe8);
            auVar66._0_4_ = auVar66._4_4_;
            auVar66._8_4_ = auVar66._12_4_;
            auVar52 = pshuflw(auVar36,auVar66,0xe8);
            auVar125._8_4_ = 0xffffffff;
            auVar125._0_8_ = 0xffffffffffffffff;
            auVar125._12_4_ = 0xffffffff;
            auVar36 = (auVar52 | auVar121 & auVar36) ^ auVar125;
            auVar36 = packssdw(auVar36,auVar36);
            if ((auVar36 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(undefined1 *)((long)__s + uVar10) = uVar1;
            }
            auVar66 = auVar65 & auVar93 | auVar66;
            auVar36 = packssdw(auVar66,auVar66);
            auVar36 = packssdw(auVar36 ^ auVar125,auVar36 ^ auVar125);
            auVar36 = packsswb(auVar36,auVar36);
            if ((auVar36._0_4_ >> 8 & 1) != 0) {
              *(undefined1 *)((long)__s + uVar10 + 1) = uVar1;
            }
            auVar36 = auVar16 ^ auVar130;
            iVar103 = -(uint)(iVar9 < auVar36._0_4_);
            auVar111._4_4_ = -(uint)(iVar102 < auVar36._4_4_);
            iVar115 = -(uint)(iVar39 < auVar36._8_4_);
            auVar111._12_4_ = -(uint)(iVar40 < auVar36._12_4_);
            auVar67._4_4_ = iVar103;
            auVar67._0_4_ = iVar103;
            auVar67._8_4_ = iVar115;
            auVar67._12_4_ = iVar115;
            auVar94._4_4_ = -(uint)(auVar36._4_4_ == iVar102);
            auVar94._12_4_ = -(uint)(auVar36._12_4_ == iVar40);
            auVar94._0_4_ = auVar94._4_4_;
            auVar94._8_4_ = auVar94._12_4_;
            auVar111._0_4_ = auVar111._4_4_;
            auVar111._8_4_ = auVar111._12_4_;
            auVar36 = auVar94 & auVar67 | auVar111;
            auVar36 = packssdw(auVar36,auVar36);
            auVar36 = packssdw(auVar36 ^ auVar125,auVar36 ^ auVar125);
            auVar36 = packsswb(auVar36,auVar36);
            if ((auVar36._0_4_ >> 0x10 & 1) != 0) {
              *(undefined1 *)((long)__s + uVar10 + 2) = uVar1;
            }
            auVar52 = pshufhw(auVar67,auVar67,0x84);
            auVar86 = pshufhw(auVar94,auVar94,0x84);
            auVar121 = pshufhw(auVar52,auVar111,0x84);
            auVar52 = (auVar121 | auVar86 & auVar52) ^ auVar125;
            auVar52 = packssdw(auVar52,auVar52);
            auVar52 = packsswb(auVar52,auVar52);
            if ((auVar52._0_4_ >> 0x18 & 1) != 0) {
              *(undefined1 *)((long)__s + uVar10 + 3) = uVar1;
            }
            auVar52 = auVar18 ^ auVar130;
            iVar103 = -(uint)(iVar9 < auVar52._0_4_);
            auVar69._4_4_ = -(uint)(iVar102 < auVar52._4_4_);
            iVar115 = -(uint)(iVar39 < auVar52._8_4_);
            auVar69._12_4_ = -(uint)(iVar40 < auVar52._12_4_);
            auVar95._4_4_ = iVar103;
            auVar95._0_4_ = iVar103;
            auVar95._8_4_ = iVar115;
            auVar95._12_4_ = iVar115;
            auVar36 = pshuflw(auVar36,auVar95,0xe8);
            auVar68._4_4_ = -(uint)(auVar52._4_4_ == iVar102);
            auVar68._12_4_ = -(uint)(auVar52._12_4_ == iVar40);
            auVar68._0_4_ = auVar68._4_4_;
            auVar68._8_4_ = auVar68._12_4_;
            auVar121 = pshuflw(auVar125,auVar68,0xe8);
            auVar69._0_4_ = auVar69._4_4_;
            auVar69._8_4_ = auVar69._12_4_;
            auVar52 = pshuflw(auVar36,auVar69,0xe8);
            auVar126._8_4_ = 0xffffffff;
            auVar126._0_8_ = 0xffffffffffffffff;
            auVar126._12_4_ = 0xffffffff;
            auVar36 = (auVar52 | auVar121 & auVar36) ^ auVar126;
            auVar36 = packssdw(auVar36,auVar36);
            auVar36 = packsswb(auVar36,auVar36);
            if ((auVar36 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(undefined1 *)((long)__s + uVar10 + 4) = uVar1;
            }
            auVar69 = auVar68 & auVar95 | auVar69;
            auVar36 = packssdw(auVar69,auVar69);
            auVar36 = packssdw(auVar36 ^ auVar126,auVar36 ^ auVar126);
            auVar36 = packsswb(auVar36,auVar36);
            if ((auVar36._4_2_ >> 8 & 1) != 0) {
              *(undefined1 *)((long)__s + uVar10 + 5) = uVar1;
            }
            auVar36 = auVar21 ^ auVar130;
            iVar103 = -(uint)(iVar9 < auVar36._0_4_);
            auVar112._4_4_ = -(uint)(iVar102 < auVar36._4_4_);
            iVar115 = -(uint)(iVar39 < auVar36._8_4_);
            auVar112._12_4_ = -(uint)(iVar40 < auVar36._12_4_);
            auVar70._4_4_ = iVar103;
            auVar70._0_4_ = iVar103;
            auVar70._8_4_ = iVar115;
            auVar70._12_4_ = iVar115;
            auVar96._4_4_ = -(uint)(auVar36._4_4_ == iVar102);
            auVar96._12_4_ = -(uint)(auVar36._12_4_ == iVar40);
            auVar96._0_4_ = auVar96._4_4_;
            auVar96._8_4_ = auVar96._12_4_;
            auVar112._0_4_ = auVar112._4_4_;
            auVar112._8_4_ = auVar112._12_4_;
            auVar36 = auVar96 & auVar70 | auVar112;
            auVar36 = packssdw(auVar36,auVar36);
            auVar36 = packssdw(auVar36 ^ auVar126,auVar36 ^ auVar126);
            auVar36 = packsswb(auVar36,auVar36);
            if ((auVar36 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(undefined1 *)((long)__s + uVar10 + 6) = uVar1;
            }
            auVar52 = pshufhw(auVar70,auVar70,0x84);
            auVar86 = pshufhw(auVar96,auVar96,0x84);
            auVar121 = pshufhw(auVar52,auVar112,0x84);
            auVar52 = (auVar121 | auVar86 & auVar52) ^ auVar126;
            auVar52 = packssdw(auVar52,auVar52);
            auVar52 = packsswb(auVar52,auVar52);
            if ((auVar52._6_2_ >> 8 & 1) != 0) {
              *(undefined1 *)((long)__s + uVar10 + 7) = uVar1;
            }
            auVar52 = auVar24 ^ auVar130;
            iVar103 = -(uint)(iVar9 < auVar52._0_4_);
            auVar72._4_4_ = -(uint)(iVar102 < auVar52._4_4_);
            iVar115 = -(uint)(iVar39 < auVar52._8_4_);
            auVar72._12_4_ = -(uint)(iVar40 < auVar52._12_4_);
            auVar97._4_4_ = iVar103;
            auVar97._0_4_ = iVar103;
            auVar97._8_4_ = iVar115;
            auVar97._12_4_ = iVar115;
            auVar36 = pshuflw(auVar36,auVar97,0xe8);
            auVar71._4_4_ = -(uint)(auVar52._4_4_ == iVar102);
            auVar71._12_4_ = -(uint)(auVar52._12_4_ == iVar40);
            auVar71._0_4_ = auVar71._4_4_;
            auVar71._8_4_ = auVar71._12_4_;
            auVar121 = pshuflw(auVar126,auVar71,0xe8);
            auVar72._0_4_ = auVar72._4_4_;
            auVar72._8_4_ = auVar72._12_4_;
            auVar52 = pshuflw(auVar36,auVar72,0xe8);
            auVar127._8_4_ = 0xffffffff;
            auVar127._0_8_ = 0xffffffffffffffff;
            auVar127._12_4_ = 0xffffffff;
            auVar36 = (auVar52 | auVar121 & auVar36) ^ auVar127;
            auVar36 = packssdw(auVar36,auVar36);
            auVar36 = packsswb(auVar36,auVar36);
            if ((auVar36 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(undefined1 *)((long)__s + uVar10 + 8) = uVar1;
            }
            auVar72 = auVar71 & auVar97 | auVar72;
            auVar36 = packssdw(auVar72,auVar72);
            auVar36 = packssdw(auVar36 ^ auVar127,auVar36 ^ auVar127);
            auVar36 = packsswb(auVar36,auVar36);
            if ((auVar36._8_2_ >> 8 & 1) != 0) {
              *(undefined1 *)((long)__s + uVar10 + 9) = uVar1;
            }
            auVar36 = auVar27 ^ auVar130;
            iVar103 = -(uint)(iVar9 < auVar36._0_4_);
            auVar113._4_4_ = -(uint)(iVar102 < auVar36._4_4_);
            iVar115 = -(uint)(iVar39 < auVar36._8_4_);
            auVar113._12_4_ = -(uint)(iVar40 < auVar36._12_4_);
            auVar73._4_4_ = iVar103;
            auVar73._0_4_ = iVar103;
            auVar73._8_4_ = iVar115;
            auVar73._12_4_ = iVar115;
            auVar98._4_4_ = -(uint)(auVar36._4_4_ == iVar102);
            auVar98._12_4_ = -(uint)(auVar36._12_4_ == iVar40);
            auVar98._0_4_ = auVar98._4_4_;
            auVar98._8_4_ = auVar98._12_4_;
            auVar113._0_4_ = auVar113._4_4_;
            auVar113._8_4_ = auVar113._12_4_;
            auVar36 = auVar98 & auVar73 | auVar113;
            auVar36 = packssdw(auVar36,auVar36);
            auVar36 = packssdw(auVar36 ^ auVar127,auVar36 ^ auVar127);
            auVar36 = packsswb(auVar36,auVar36);
            if ((auVar36 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              *(undefined1 *)((long)__s + uVar10 + 10) = uVar1;
            }
            auVar52 = pshufhw(auVar73,auVar73,0x84);
            auVar86 = pshufhw(auVar98,auVar98,0x84);
            auVar121 = pshufhw(auVar52,auVar113,0x84);
            auVar52 = (auVar121 | auVar86 & auVar52) ^ auVar127;
            auVar52 = packssdw(auVar52,auVar52);
            auVar52 = packsswb(auVar52,auVar52);
            if ((auVar52._10_2_ >> 8 & 1) != 0) {
              *(undefined1 *)((long)__s + uVar10 + 0xb) = uVar1;
            }
            auVar52 = auVar30 ^ auVar130;
            iVar103 = -(uint)(iVar9 < auVar52._0_4_);
            auVar75._4_4_ = -(uint)(iVar102 < auVar52._4_4_);
            iVar115 = -(uint)(iVar39 < auVar52._8_4_);
            auVar75._12_4_ = -(uint)(iVar40 < auVar52._12_4_);
            auVar99._4_4_ = iVar103;
            auVar99._0_4_ = iVar103;
            auVar99._8_4_ = iVar115;
            auVar99._12_4_ = iVar115;
            auVar36 = pshuflw(auVar36,auVar99,0xe8);
            auVar74._4_4_ = -(uint)(auVar52._4_4_ == iVar102);
            auVar74._12_4_ = -(uint)(auVar52._12_4_ == iVar40);
            auVar74._0_4_ = auVar74._4_4_;
            auVar74._8_4_ = auVar74._12_4_;
            auVar121 = pshuflw(auVar127,auVar74,0xe8);
            auVar75._0_4_ = auVar75._4_4_;
            auVar75._8_4_ = auVar75._12_4_;
            auVar52 = pshuflw(auVar36,auVar75,0xe8);
            in_XMM13._8_4_ = 0xffffffff;
            in_XMM13._0_8_ = 0xffffffffffffffff;
            in_XMM13._12_4_ = 0xffffffff;
            auVar36 = (auVar52 | auVar121 & auVar36) ^ in_XMM13;
            auVar36 = packssdw(auVar36,auVar36);
            auVar36 = packsswb(auVar36,auVar36);
            if ((auVar36 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(undefined1 *)((long)__s + uVar10 + 0xc) = uVar1;
            }
            auVar75 = auVar74 & auVar99 | auVar75;
            auVar36 = packssdw(auVar75,auVar75);
            auVar36 = packssdw(auVar36 ^ in_XMM13,auVar36 ^ in_XMM13);
            auVar36 = packsswb(auVar36,auVar36);
            if ((auVar36._12_2_ >> 8 & 1) != 0) {
              *(undefined1 *)((long)__s + uVar10 + 0xd) = uVar1;
            }
            auVar36 = auVar33 ^ auVar130;
            auVar114._0_4_ = -(uint)(iVar9 < auVar36._0_4_);
            auVar114._4_4_ = -(uint)(iVar102 < auVar36._4_4_);
            auVar114._8_4_ = -(uint)(iVar39 < auVar36._8_4_);
            auVar114._12_4_ = -(uint)(iVar40 < auVar36._12_4_);
            auVar76._4_4_ = auVar114._0_4_;
            auVar76._0_4_ = auVar114._0_4_;
            auVar76._8_4_ = auVar114._8_4_;
            auVar76._12_4_ = auVar114._8_4_;
            iVar9 = -(uint)(auVar36._4_4_ == iVar102);
            iVar102 = -(uint)(auVar36._12_4_ == iVar40);
            auVar38._4_4_ = iVar9;
            auVar38._0_4_ = iVar9;
            auVar38._8_4_ = iVar102;
            auVar38._12_4_ = iVar102;
            auVar100._4_4_ = auVar114._4_4_;
            auVar100._0_4_ = auVar114._4_4_;
            auVar100._8_4_ = auVar114._12_4_;
            auVar100._12_4_ = auVar114._12_4_;
            in_XMM12 = auVar38 & auVar76 | auVar100;
            auVar36 = packssdw(auVar114,in_XMM12);
            auVar36 = packssdw(auVar36 ^ in_XMM13,auVar36 ^ in_XMM13);
            auVar36 = packsswb(auVar36,auVar36);
            if ((auVar36 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(undefined1 *)((long)__s + uVar10 + 0xe) = uVar1;
            }
            auVar52 = pshufhw(auVar76,auVar76,0x84);
            auVar36 = pshufhw(auVar38,auVar38,0x84);
            auVar121 = pshufhw(auVar52,auVar100,0x84);
            auVar36 = packssdw(auVar36 & auVar52,(auVar121 | auVar36 & auVar52) ^ in_XMM13);
            auVar36 = packsswb(auVar36,auVar36);
            if ((auVar36._14_2_ >> 8 & 1) != 0) {
              *(undefined1 *)((long)__s + uVar10 + 0xf) = uVar1;
            }
            uVar10 = uVar10 + 0x10;
            lVar6 = auVar14._8_8_;
            auVar14._0_8_ = auVar14._0_8_ + 0x10;
            auVar14._8_8_ = lVar6 + 0x10;
            lVar6 = auVar16._8_8_;
            auVar16._0_8_ = auVar16._0_8_ + 0x10;
            auVar16._8_8_ = lVar6 + 0x10;
            lVar6 = auVar18._8_8_;
            auVar18._0_8_ = auVar18._0_8_ + 0x10;
            auVar18._8_8_ = lVar6 + 0x10;
            lVar6 = auVar21._8_8_;
            auVar21._0_8_ = auVar21._0_8_ + 0x10;
            auVar21._8_8_ = lVar6 + 0x10;
            lVar6 = auVar24._8_8_;
            auVar24._0_8_ = auVar24._0_8_ + 0x10;
            auVar24._8_8_ = lVar6 + 0x10;
            lVar6 = auVar27._8_8_;
            auVar27._0_8_ = auVar27._0_8_ + 0x10;
            auVar27._8_8_ = lVar6 + 0x10;
            lVar6 = auVar30._8_8_;
            auVar30._0_8_ = auVar30._0_8_ + 0x10;
            auVar30._8_8_ = lVar6 + 0x10;
            lVar6 = auVar33._8_8_;
            auVar33._0_8_ = auVar33._0_8_ + 0x10;
            auVar33._8_8_ = lVar6 + 0x10;
            uVar11 = __n;
          } while ((left + 0xfU & 0xfffffff0) != uVar10);
        }
        iVar9 = src->w;
        if ((long)iVar9 < 0xc) {
          if ((int)uVar11 < iVar9 + left) {
            do {
              *(undefined1 *)((long)__s + uVar11) = __src_00[uVar11 + (-lVar7 - lVar5)];
              uVar11 = uVar11 + 1;
            } while ((long)uVar11 < src->w + lVar7);
          }
        }
        else {
          memcpy((void *)((long)__s + lVar7),__src,(long)iVar9);
          uVar11 = (ulong)(uint)((int)uVar11 + src->w);
          auVar130 = _DAT_0015d1a0;
        }
        if ((int)uVar11 < (int)uVar2) {
          lVar6 = (long)(int)uVar11;
          do {
            *(undefined1 *)((long)__s + lVar6) = __src[(long)src->w + -1];
            lVar6 = lVar6 + 1;
          } while (lVar4 != lVar6);
        }
        __s = (void *)((long)__s + lVar4);
        iVar101 = iVar101 + 1;
      } while (iVar101 != iVar3);
    }
  }
  return;
}

Assistant:

static void copy_make_border_image(const Mat& src, Mat& dst, int top, int left, int type, T v)
{
    int w = dst.w;
    int h = dst.h;

    const T* ptr = src;
    T* outptr = dst;

    if (type == 0)
    {
        int y = 0;
        // fill top
        for (; y < top; y++)
        {
            int x = 0;
            for (; x < w; x++)
            {
                outptr[x] = v;
            }
            outptr += w;
        }
        // fill center
        for (; y < (top + src.h); y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = v;
            }
            if (src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = v;
            }
            ptr += src.w;
            outptr += w;
        }
        // fill bottom
        for (; y < h; y++)
        {
            int x = 0;
            for (; x < w; x++)
            {
                outptr[x] = v;
            }
            outptr += w;
        }
    }
    else if (type == 1)
    {
        int y = 0;
        // fill top
        for (; y < top; y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[0];
            }
            if(src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - 1];
            }
            outptr += w;
        }
        // fill center
        for (; y < (top + src.h); y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[0];
            }
            if(src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - 1];
            }
            ptr += src.w;
            outptr += w;
        }
        // fill bottom
        ptr -= src.w;
        for (; y < h; y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[0];
            }
            if(src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - 1];
            }
            outptr += w;
        }
    }
}